

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O2

bool absl::debugging_internal::ParseEncoding(State *state)

{
  ParseState *pPVar1;
  undefined1 *puVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  int iVar11;
  
  iVar11 = state->recursion_depth;
  iVar3 = state->steps;
  state->recursion_depth = iVar11 + 1;
  state->steps = iVar3 + 1;
  if (0x1ffff < iVar3 || 0xff < iVar11) {
    bVar8 = false;
    goto LAB_00252d49;
  }
  bVar8 = ParseName(state);
  if (bVar8) {
    bVar9 = ParseBareFunctionType(state);
    bVar8 = true;
    if (bVar9) {
      ParseQRequiresClauseExpr(state);
    }
    goto LAB_00252d49;
  }
  iVar11 = state->recursion_depth;
  iVar3 = state->steps;
  state->recursion_depth = iVar11 + 1;
  state->steps = iVar3 + 1;
  if (iVar3 < 0x20000 && iVar11 < 0x100) {
    pPVar1 = &state->parse_state;
    iVar11 = (state->parse_state).prev_name_idx;
    uVar6 = (state->parse_state).mangled_idx;
    uVar7 = (state->parse_state).out_cur_idx;
    uVar4 = *(uint *)&(state->parse_state).field_0xc;
    bVar8 = ParseTwoCharToken(state,"TW");
    if (bVar8) {
      MaybeAppend(state,"thread-local wrapper routine for ");
      bVar9 = ParseName(state);
LAB_00252d23:
      bVar8 = true;
      if (bVar9 == false) {
LAB_00252d2a:
        (state->parse_state).prev_name_idx = iVar11;
        pPVar1->mangled_idx = uVar6;
        pPVar1->out_cur_idx = uVar7;
        *(uint *)&(state->parse_state).field_0xc = uVar4;
        bVar8 = false;
      }
    }
    else {
      bVar8 = ParseTwoCharToken(state,"TH");
      if (bVar8) {
        MaybeAppend(state,"thread-local initialization routine for ");
        bVar9 = ParseName(state);
        goto LAB_00252d23;
      }
      bVar8 = ParseOneCharToken(state,'T');
      if ((!bVar8) || (bVar8 = ParseCharClass(state,"VTIS"), !bVar8)) {
LAB_00252d8c:
        (state->parse_state).prev_name_idx = iVar11;
        pPVar1->mangled_idx = uVar6;
        pPVar1->out_cur_idx = uVar7;
        *(uint *)&(state->parse_state).field_0xc = uVar4;
        bVar8 = ParseTwoCharToken(state,"Tc");
        if (((bVar8) && (bVar8 = ParseCallOffset(state), bVar8)) &&
           (bVar8 = ParseCallOffset(state), bVar8)) {
          bVar9 = ParseEncoding(state);
          bVar8 = true;
          if (bVar9) goto LAB_00252d41;
        }
        (state->parse_state).prev_name_idx = iVar11;
        pPVar1->mangled_idx = uVar6;
        pPVar1->out_cur_idx = uVar7;
        *(uint *)&(state->parse_state).field_0xc = uVar4;
        bVar8 = ParseTwoCharToken(state,"GV");
        if (bVar8) {
          bVar9 = ParseName(state);
          bVar8 = true;
          if (bVar9) goto LAB_00252d41;
        }
        (state->parse_state).prev_name_idx = iVar11;
        pPVar1->mangled_idx = uVar6;
        pPVar1->out_cur_idx = uVar7;
        *(uint *)&(state->parse_state).field_0xc = uVar4;
        bVar8 = ParseOneCharToken(state,'T');
        if ((bVar8) && (bVar8 = ParseCallOffset(state), bVar8)) {
          bVar9 = ParseEncoding(state);
          bVar8 = true;
          if (bVar9) goto LAB_00252d41;
        }
        (state->parse_state).prev_name_idx = iVar11;
        pPVar1->mangled_idx = uVar6;
        pPVar1->out_cur_idx = uVar7;
        *(uint *)&(state->parse_state).field_0xc = uVar4;
        bVar8 = ParseTwoCharToken(state,"TC");
        if (((bVar8) && (bVar8 = ParseType(state), bVar8)) &&
           ((bVar8 = ParseNumber(state,(int *)0x0), bVar8 &&
            (bVar8 = ParseOneCharToken(state,'_'), bVar8)))) {
          puVar2 = &(state->parse_state).field_0xf;
          *puVar2 = *puVar2 & 0x7f;
          bVar8 = ParseType(state);
          if (!bVar8) goto LAB_00252ed8;
          *(uint *)&(state->parse_state).field_0xc =
               *(uint *)&(state->parse_state).field_0xc & 0x7fffffff | uVar4 & 0x80000000;
LAB_002530c9:
          bVar8 = true;
          goto LAB_00252d41;
        }
LAB_00252ed8:
        (state->parse_state).prev_name_idx = iVar11;
        pPVar1->mangled_idx = uVar6;
        pPVar1->out_cur_idx = uVar7;
        *(uint *)&(state->parse_state).field_0xc = uVar4;
        bVar8 = ParseOneCharToken(state,'T');
        if ((bVar8) && (bVar8 = ParseCharClass(state,"FJ"), bVar8)) {
          bVar9 = ParseType(state);
          bVar8 = true;
          if (bVar9) goto LAB_00252d41;
        }
        (state->parse_state).prev_name_idx = iVar11;
        pPVar1->mangled_idx = uVar6;
        pPVar1->out_cur_idx = uVar7;
        *(uint *)&(state->parse_state).field_0xc = uVar4;
        bVar8 = ParseTwoCharToken(state,"GR");
        if (bVar8) {
          MaybeAppend(state,"reference temporary for ");
          bVar8 = ParseName(state);
          if (bVar8) {
            bVar9 = ParseSeqId(state);
            bVar10 = ParseOneCharToken(state,'_');
            bVar8 = true;
            if ((bVar10) || (!bVar9)) goto LAB_00252d41;
          }
        }
        else {
          bVar8 = ParseTwoCharToken(state,"GA");
          if (bVar8) {
            bVar9 = ParseEncoding(state);
            bVar8 = true;
            if (bVar9) goto LAB_00252d41;
          }
          (state->parse_state).prev_name_idx = iVar11;
          pPVar1->mangled_idx = uVar6;
          pPVar1->out_cur_idx = uVar7;
          *(uint *)&(state->parse_state).field_0xc = uVar4;
          bVar8 = ParseThreeCharToken(state,"GTt");
          if (bVar8) {
            MaybeAppend(state,"transaction clone for ");
            bVar9 = ParseEncoding(state);
            bVar8 = true;
            if (bVar9) goto LAB_00252d41;
          }
          (state->parse_state).prev_name_idx = iVar11;
          pPVar1->mangled_idx = uVar6;
          pPVar1->out_cur_idx = uVar7;
          *(uint *)&(state->parse_state).field_0xc = uVar4;
          bVar8 = ParseOneCharToken(state,'T');
          if (((bVar8) && (bVar8 = ParseCharClass(state,"hv"), bVar8)) &&
             (bVar8 = ParseCallOffset(state), bVar8)) {
            bVar9 = ParseEncoding(state);
            bVar8 = true;
            if (bVar9) goto LAB_00252d41;
          }
          (state->parse_state).prev_name_idx = iVar11;
          pPVar1->mangled_idx = uVar6;
          pPVar1->out_cur_idx = uVar7;
          *(uint *)&(state->parse_state).field_0xc = uVar4;
          bVar8 = ParseTwoCharToken(state,"TA");
          if (bVar8) {
            uVar5 = *(uint *)&(state->parse_state).field_0xc;
            *(uint *)&(state->parse_state).field_0xc = uVar5 & 0x7fffffff;
            bVar8 = ParseTemplateArg(state);
            if (bVar8) {
              *(uint *)&(state->parse_state).field_0xc =
                   *(uint *)&(state->parse_state).field_0xc & 0x7fffffff | uVar5 & 0x80000000;
              MaybeAppend(state,"template parameter object");
              goto LAB_002530c9;
            }
          }
        }
        goto LAB_00252d2a;
      }
      bVar9 = ParseType(state);
      bVar8 = true;
      if (!bVar9) goto LAB_00252d8c;
    }
LAB_00252d41:
    iVar11 = state->recursion_depth + -1;
  }
  else {
    bVar8 = false;
  }
  state->recursion_depth = iVar11;
LAB_00252d49:
  state->recursion_depth = state->recursion_depth + -1;
  return bVar8;
}

Assistant:

static bool ParseEncoding(State *state) {
  ComplexityGuard guard(state);
  if (guard.IsTooComplex()) return false;
  // Since the first two productions both start with <name>, attempt
  // to parse it only once to avoid exponential blowup of backtracking.
  //
  // We're careful about exponential blowup because <encoding> recursively
  // appears in other productions downstream of its first two productions,
  // which means that every call to `ParseName` would possibly indirectly
  // result in two calls to `ParseName` etc.
  if (ParseName(state)) {
    if (!ParseBareFunctionType(state)) {
      return true;  // <(data) name>
    }

    // Parsed: <(function) name> <bare-function-type>
    // Pending: [`Q` <requires-clause expr>]
    ParseQRequiresClauseExpr(state);  // restores state on failure
    return true;
  }

  if (ParseSpecialName(state)) {
    return true;  // <special-name>
  }
  return false;
}